

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O3

void __thiscall hwnet::util::TimerMgr::pop(TimerMgr *this)

{
  pointer ppTVar1;
  Timer *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t sVar3;
  value_type e;
  
  sVar3 = this->elements_size;
  if (sVar3 != 0) {
    ppTVar1 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = *ppTVar1;
    if (sVar3 != 1) {
      *ppTVar1 = ppTVar1[sVar3 - 1];
      (this->elements).
      super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>._M_impl.
      super__Vector_impl_data._M_start[sVar3 - 1] = pTVar2;
      ppTVar1 = (this->elements).
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      (*ppTVar1)->mIndex = 1;
      ppTVar1[sVar3 - 1]->mIndex = sVar3;
    }
    this_00 = (pTVar2->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (pTVar2->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pTVar2->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pTVar2->mMgr = (TimerMgr *)0x0;
    pTVar2->mIndex = 0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      sVar3 = this->elements_size;
    }
    (this->elements).super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[sVar3 - 1] = (Timer *)0x0;
    this->elements_size = sVar3 - 1;
    down(this,1);
    return;
  }
  return;
}

Assistant:

void pop() {
		if(this->elements_size > 0) {
			auto e = this->elements[0];
			this->swap(1,this->elements_size);
			e->mIndex = 0;
			e->mMgr  = nullptr;		
			e->selfPtr = nullptr;	
			this->elements[this->elements_size-1] = nullptr;
			--this->elements_size;
			this->down(1);
		}
	}